

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O0

int Cec_ManSeqResimulate(Cec_ManSim_t *p,Vec_Ptr_t *vInfo)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  void *pvVar6;
  int local_40;
  int local_3c;
  int w;
  int k;
  int i;
  int f;
  uint *pInfo1;
  uint *pInfo0;
  Vec_Ptr_t *vInfo_local;
  Cec_ManSim_t *p_local;
  
  iVar2 = Vec_PtrSize(vInfo);
  iVar3 = Gia_ManRegNum(p->pAig);
  iVar4 = Gia_ManPiNum(p->pAig);
  if (iVar2 != iVar3 + iVar4 * p->pPars->nFrames) {
    __assert_fail("Vec_PtrSize(vInfo) == Gia_ManRegNum(p->pAig) + Gia_ManPiNum(p->pAig) * p->pPars->nFrames"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                  ,0x8e,"int Cec_ManSeqResimulate(Cec_ManSim_t *, Vec_Ptr_t *)");
  }
  for (local_3c = 0; iVar2 = Gia_ManRegNum(p->pAig), local_3c < iVar2; local_3c = local_3c + 1) {
    pvVar5 = Vec_PtrEntry(vInfo,local_3c);
    pVVar1 = p->vCoSimInfo;
    iVar2 = Gia_ManPoNum(p->pAig);
    pvVar6 = Vec_PtrEntry(pVVar1,iVar2 + local_3c);
    for (local_40 = 0; local_40 < p->nWords; local_40 = local_40 + 1) {
      *(undefined4 *)((long)pvVar6 + (long)local_40 * 4) =
           *(undefined4 *)((long)pvVar5 + (long)local_40 * 4);
    }
  }
  k = 0;
  while( true ) {
    if (p->pPars->nFrames <= k) {
      iVar2 = Vec_PtrSize(vInfo);
      if (local_3c == iVar2) {
        return 0;
      }
      __assert_fail("k == Vec_PtrSize(vInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                    ,0xa9,"int Cec_ManSeqResimulate(Cec_ManSim_t *, Vec_Ptr_t *)");
    }
    for (w = 0; iVar2 = Gia_ManPiNum(p->pAig), w < iVar2; w = w + 1) {
      pvVar5 = Vec_PtrEntry(vInfo,local_3c);
      pvVar6 = Vec_PtrEntry(p->vCiSimInfo,w);
      for (local_40 = 0; local_40 < p->nWords; local_40 = local_40 + 1) {
        *(undefined4 *)((long)pvVar6 + (long)local_40 * 4) =
             *(undefined4 *)((long)pvVar5 + (long)local_40 * 4);
      }
      local_3c = local_3c + 1;
    }
    for (w = 0; iVar2 = Gia_ManRegNum(p->pAig), w < iVar2; w = w + 1) {
      pVVar1 = p->vCoSimInfo;
      iVar2 = Gia_ManPoNum(p->pAig);
      pvVar5 = Vec_PtrEntry(pVVar1,iVar2 + w);
      pVVar1 = p->vCiSimInfo;
      iVar2 = Gia_ManPiNum(p->pAig);
      pvVar6 = Vec_PtrEntry(pVVar1,iVar2 + w);
      for (local_40 = 0; local_40 < p->nWords; local_40 = local_40 + 1) {
        *(undefined4 *)((long)pvVar6 + (long)local_40 * 4) =
             *(undefined4 *)((long)pvVar5 + (long)local_40 * 4);
      }
    }
    iVar2 = Cec_ManSimSimulateRound(p,p->vCiSimInfo,p->vCoSimInfo);
    if (iVar2 != 0) break;
    k = k + 1;
  }
  return 1;
}

Assistant:

int Cec_ManSeqResimulate( Cec_ManSim_t * p, Vec_Ptr_t * vInfo )
{
    unsigned * pInfo0, * pInfo1;
    int f, i, k, w;
//    assert( Gia_ManRegNum(p->pAig) > 0 );
    assert( Vec_PtrSize(vInfo) == Gia_ManRegNum(p->pAig) + Gia_ManPiNum(p->pAig) * p->pPars->nFrames );
    for ( k = 0; k < Gia_ManRegNum(p->pAig); k++ )
    {
        pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, k );
        pInfo1 = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, Gia_ManPoNum(p->pAig) + k );
        for ( w = 0; w < p->nWords; w++ )
            pInfo1[w] = pInfo0[w];
    }
    for ( f = 0; f < p->pPars->nFrames; f++ )
    {
        for ( i = 0; i < Gia_ManPiNum(p->pAig); i++ )
        {
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, k++ );
            pInfo1 = (unsigned *)Vec_PtrEntry( p->vCiSimInfo, i );
            for ( w = 0; w < p->nWords; w++ )
                pInfo1[w] = pInfo0[w];
        }
        for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        {
            pInfo0 = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, Gia_ManPoNum(p->pAig) + i );
            pInfo1 = (unsigned *)Vec_PtrEntry( p->vCiSimInfo, Gia_ManPiNum(p->pAig) + i );
            for ( w = 0; w < p->nWords; w++ )
                pInfo1[w] = pInfo0[w];
        }
        if ( Cec_ManSimSimulateRound( p, p->vCiSimInfo, p->vCoSimInfo ) )
            return 1;
    }
    assert( k == Vec_PtrSize(vInfo) );
    return 0;
}